

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

string * __thiscall
LinkedReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LinkedReadsDatastore *this,size_t readID)

{
  uint64_t uVar1;
  FILE *pFVar2;
  uint64_t uVar3;
  long lVar4;
  size_t sVar5;
  char *__s;
  undefined8 uStack_30;
  
  if ((readID == 0) ||
     ((ulong)((long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 1) < readID)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    uStack_30 = 0x18cb5d;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar4 = -(this->readsize + 0x10 & 0xfffffffffffffff0);
    __s = &stack0xffffffffffffffd8 + lVar4;
    uVar1 = this->readsize;
    pFVar2 = (FILE *)this->fd;
    uVar3 = this->readpos_offset;
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x18cb9a;
    fseek(pFVar2,(readID - 1) * (uVar1 + 1) + uVar3,0);
    uVar1 = this->readsize;
    pFVar2 = (FILE *)this->fd;
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x18cbb5;
    fread(__s,uVar1 + 1,1,pFVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x18cbc4;
    sVar5 = strlen(__s);
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x18cbd3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinkedReadsDatastore::get_read_sequence(size_t readID) {
    if (readID==0 or readID>size()) return "";
    char buffer[readsize+1];
    size_t read_offset_in_file=readpos_offset+(readsize+1)*(readID-1);
    fseek(fd,read_offset_in_file,SEEK_SET);
    fread(buffer,readsize+1,1,fd);
    return std::string(buffer);
}